

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

aiAnimation * __thiscall Assimp::Ogre::Animation::ConvertToAssimpAnimation(Animation *this)

{
  pointer pVVar1;
  pointer pVVar2;
  aiAnimation *this_00;
  ulong uVar3;
  aiNodeAnim **ppaVar4;
  aiNodeAnim *paVar5;
  long lVar6;
  size_t i;
  ulong uVar7;
  size_t len;
  
  this_00 = (aiAnimation *)operator_new(0x448);
  aiAnimation::aiAnimation(this_00);
  uVar3 = (this->name)._M_string_length;
  if (uVar3 < 0x400) {
    (this_00->mName).length = (ai_uint32)uVar3;
    memcpy((this_00->mName).data,(this->name)._M_dataplus._M_p,uVar3);
    (this_00->mName).data[uVar3] = '\0';
  }
  this_00->mDuration = (double)this->length;
  this_00->mTicksPerSecond = 1.0;
  pVVar1 = (this->tracks).
           super__Vector_base<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this->tracks).
           super__Vector_base<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar1 != pVVar2) {
    uVar3 = ((long)pVVar2 - (long)pVVar1) / 0x70;
    this_00->mNumChannels = (uint)uVar3;
    ppaVar4 = (aiNodeAnim **)operator_new__((uVar3 & 0xffffffff) << 3);
    this_00->mChannels = ppaVar4;
    lVar6 = 0;
    for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
      paVar5 = VertexAnimationTrack::ConvertToAssimpAnimationNode
                         ((VertexAnimationTrack *)
                          ((long)&((this->tracks).
                                   super__Vector_base<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->type + lVar6),
                          this->parentSkeleton);
      this_00->mChannels[uVar7] = paVar5;
      lVar6 = lVar6 + 0x70;
    }
  }
  return this_00;
}

Assistant:

aiAnimation *Animation::ConvertToAssimpAnimation()
{
    aiAnimation *anim = new aiAnimation();
    anim->mName = name;
    anim->mDuration = static_cast<double>(length);
    anim->mTicksPerSecond = 1.0;

    // Tracks
    if (!tracks.empty())
    {
        anim->mNumChannels = static_cast<unsigned int>(tracks.size());
        anim->mChannels = new aiNodeAnim*[anim->mNumChannels];

        for(size_t i=0, len=tracks.size(); i<len; ++i)
        {
            anim->mChannels[i] = tracks[i].ConvertToAssimpAnimationNode(parentSkeleton);
        }
    }
    return anim;
}